

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O0

void __thiscall OpenMD::P2Z::process(P2Z *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  SnapshotManager *this_00;
  Snapshot *pSVar7;
  P2R *in_RDI;
  double dVar8;
  RealType cosangle_2;
  Vector3d vec_2;
  Vector3d r2_1;
  Vector3d r1_1;
  RealType cosangle_1;
  Vector3d vec_1;
  Vector3d r2;
  int sd2Index;
  StuntDouble *sd1A;
  int sd1Aind;
  Vector3d r1;
  RealType cosangle;
  Vector3d vec;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int jj;
  int ii;
  StuntDouble *sd2;
  StuntDouble *sd1;
  Vector3d zhat;
  StuntDouble *in_stack_ffffffffffffea58;
  DumpReader *in_stack_ffffffffffffea60;
  SimInfo *in_stack_ffffffffffffea68;
  undefined7 in_stack_ffffffffffffea70;
  undefined1 in_stack_ffffffffffffea77;
  DumpReader *in_stack_ffffffffffffea80;
  errorStruct *in_stack_ffffffffffffea88;
  SelectionEvaluator *in_stack_ffffffffffffea98;
  StuntDouble *in_stack_ffffffffffffead8;
  Snapshot *in_stack_ffffffffffffeae0;
  double in_stack_ffffffffffffeae8;
  undefined7 in_stack_ffffffffffffeaf0;
  undefined1 in_stack_ffffffffffffeaf7;
  string *in_stack_ffffffffffffecb0;
  SimInfo *in_stack_ffffffffffffecb8;
  DumpReader *in_stack_ffffffffffffecc0;
  P2R *in_stack_ffffffffffffed40;
  uint local_12b0;
  StuntDouble *local_30;
  DumpReader *local_28;
  Vector<double,_3U> local_20;
  
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_ffffffffffffea60,
             (Vector3<double> *)in_stack_ffffffffffffea58);
  pdVar6 = Vector<double,_3U>::operator[](&local_20,*(uint *)&in_RDI->field_0xd64);
  *pdVar6 = 1.0;
  SimInfo::getSimParams((in_RDI->super_StaticAnalyser).info_);
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x196d7f);
  DumpReader::DumpReader
            (in_stack_ffffffffffffecc0,in_stack_ffffffffffffecb8,in_stack_ffffffffffffecb0);
  iVar3 = DumpReader::getNFrames(in_stack_ffffffffffffea60);
  in_RDI->nProcessed_ = iVar3 / (in_RDI->super_StaticAnalyser).step_;
  in_RDI->P2_ = 0.0;
  in_RDI->count_ = 0;
  for (local_12b0 = 0; (int)local_12b0 < iVar3;
      local_12b0 = (in_RDI->super_StaticAnalyser).step_ + local_12b0) {
    DumpReader::readFrame
              ((DumpReader *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0),
               (int)((ulong)in_stack_ffffffffffffeae8 >> 0x20));
    this_00 = SimInfo::getSnapshotManager((in_RDI->super_StaticAnalyser).info_);
    pSVar7 = SnapshotManager::getCurrentSnapshot(this_00);
    in_RDI->currentSnapshot_ = pSVar7;
    bVar2 = SelectionEvaluator::isDynamic(&in_RDI->evaluator1_);
    if (bVar2) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffea98);
      SelectionManager::setSelectionSet
                ((SelectionManager *)CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                 (SelectionSet *)in_stack_ffffffffffffea68);
      SelectionSet::~SelectionSet((SelectionSet *)0x196efd);
    }
    if ((in_RDI->doVect_ & 1U) == 0) {
      if ((in_RDI->doOffset_ & 1U) == 0) {
        bVar2 = SelectionEvaluator::isDynamic(&in_RDI->evaluator2_);
        if (bVar2) {
          in_stack_ffffffffffffea98 = (SelectionEvaluator *)&in_RDI->seleMan2_;
          SelectionEvaluator::evaluate(in_stack_ffffffffffffea98);
          SelectionManager::setSelectionSet
                    ((SelectionManager *)
                     CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                     (SelectionSet *)in_stack_ffffffffffffea68);
          SelectionSet::~SelectionSet((SelectionSet *)0x1974aa);
        }
        iVar4 = SelectionManager::getSelectionCount((SelectionManager *)0x1974e6);
        iVar5 = SelectionManager::getSelectionCount((SelectionManager *)0x197500);
        if (iVar4 != iVar5) {
          in_stack_ffffffffffffea88 = &painCave;
          snprintf(painCave.errMsg,2000,
                   "In frame %d, the number of selected StuntDoubles are\n\tnot the same in --sele1 and sele2\n"
                   ,(ulong)local_12b0);
          in_stack_ffffffffffffea88->severity = 3;
          in_stack_ffffffffffffea88->isFatal = 0;
          simError();
        }
        local_28 = (DumpReader *)
                   SelectionManager::beginSelected
                             ((SelectionManager *)
                              CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                              (int *)in_stack_ffffffffffffea68);
        in_stack_ffffffffffffea80 = local_28;
        local_30 = SelectionManager::beginSelected
                             ((SelectionManager *)
                              CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                              (int *)in_stack_ffffffffffffea68);
        while (in_stack_ffffffffffffea77 =
                    local_28 != (DumpReader *)0x0 && local_30 != (StuntDouble *)0x0,
              local_28 != (DumpReader *)0x0 && local_30 != (StuntDouble *)0x0) {
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea68);
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea68);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea68,
                            (Vector<double,_3U> *)in_stack_ffffffffffffea60);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffea60,
                     (Vector<double,_3U> *)in_stack_ffffffffffffea58);
          if (bVar1) {
            Snapshot::wrapVector(in_stack_ffffffffffffeae0,(Vector3d *)in_stack_ffffffffffffead8);
          }
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffea60);
          in_stack_ffffffffffffea68 =
               (SimInfo *)
               dot<double,3u>((Vector<double,_3U> *)
                              CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                              (Vector<double,_3U> *)in_stack_ffffffffffffea68);
          in_RDI->P2_ = ((double)in_stack_ffffffffffffea68 * 3.0 * (double)in_stack_ffffffffffffea68
                        + -1.0) * 0.5 + in_RDI->P2_;
          in_RDI->count_ = in_RDI->count_ + 1;
          local_28 = (DumpReader *)
                     SelectionManager::nextSelected
                               ((SelectionManager *)
                                CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                                (int *)in_stack_ffffffffffffea68);
          in_stack_ffffffffffffea60 = local_28;
          in_stack_ffffffffffffea58 =
               SelectionManager::nextSelected
                         ((SelectionManager *)
                          CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                          (int *)in_stack_ffffffffffffea68);
          local_30 = in_stack_ffffffffffffea58;
        }
      }
      else {
        in_stack_ffffffffffffead8 =
             SelectionManager::beginSelected
                       ((SelectionManager *)
                        CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                        (int *)in_stack_ffffffffffffea68);
        local_28 = (DumpReader *)in_stack_ffffffffffffead8;
        while (local_28 != (DumpReader *)0x0) {
          Vector3<double>::Vector3((Vector3<double> *)0x1971d1);
          if ((in_RDI->doOffset2_ & 1U) == 0) {
            StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea68);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffea60,
                       (Vector3<double> *)in_stack_ffffffffffffea58);
          }
          else {
            StuntDouble::getGlobalIndex((StuntDouble *)local_28);
            SimInfo::getIOIndexToIntegrableObject
                      (in_stack_ffffffffffffea68,(int)((ulong)in_stack_ffffffffffffea60 >> 0x20));
            StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea68);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffea60,
                       (Vector3<double> *)in_stack_ffffffffffffea58);
          }
          StuntDouble::getGlobalIndex((StuntDouble *)local_28);
          SimInfo::getIOIndexToIntegrableObject
                    (in_stack_ffffffffffffea68,(int)((ulong)in_stack_ffffffffffffea60 >> 0x20));
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea68);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea68,
                            (Vector<double,_3U> *)in_stack_ffffffffffffea60);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffea60,
                     (Vector<double,_3U> *)in_stack_ffffffffffffea58);
          if (bVar1) {
            Snapshot::wrapVector(in_stack_ffffffffffffeae0,(Vector3d *)in_stack_ffffffffffffead8);
          }
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffea60);
          dVar8 = dot<double,3u>((Vector<double,_3U> *)
                                 CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                                 (Vector<double,_3U> *)in_stack_ffffffffffffea68);
          in_RDI->P2_ = (dVar8 * 3.0 * dVar8 + -1.0) * 0.5 + in_RDI->P2_;
          in_RDI->count_ = in_RDI->count_ + 1;
          local_28 = (DumpReader *)
                     SelectionManager::nextSelected
                               ((SelectionManager *)
                                CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                                (int *)in_stack_ffffffffffffea68);
        }
      }
    }
    else {
      local_28 = (DumpReader *)
                 SelectionManager::beginSelected
                           ((SelectionManager *)
                            CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                            (int *)in_stack_ffffffffffffea68);
      while (local_28 != (DumpReader *)0x0) {
        in_stack_ffffffffffffeaf7 =
             StuntDouble::isDirectional((StuntDouble *)in_stack_ffffffffffffea60);
        if ((bool)in_stack_ffffffffffffeaf7) {
          StuntDouble::getA((StuntDouble *)in_stack_ffffffffffffea68);
          SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_ffffffffffffea98);
          OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_ffffffffffffea88,
                            (Vector<double,_3U> *)in_stack_ffffffffffffea80);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffea60,
                     (Vector<double,_3U> *)in_stack_ffffffffffffea58);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x19702e);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x19703b);
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffea60);
          in_stack_ffffffffffffeae8 =
               dot<double,3u>((Vector<double,_3U> *)
                              CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                              (Vector<double,_3U> *)in_stack_ffffffffffffea68);
          in_RDI->P2_ = (in_stack_ffffffffffffeae8 * 3.0 * in_stack_ffffffffffffeae8 + -1.0) * 0.5 +
                        in_RDI->P2_;
          in_RDI->count_ = in_RDI->count_ + 1;
        }
        in_stack_ffffffffffffeae0 =
             (Snapshot *)
             SelectionManager::nextSelected
                       ((SelectionManager *)
                        CONCAT17(in_stack_ffffffffffffea77,in_stack_ffffffffffffea70),
                        (int *)in_stack_ffffffffffffea68);
        local_28 = (DumpReader *)in_stack_ffffffffffffeae0;
      }
    }
  }
  P2R::processHistogram(in_RDI);
  P2R::writeP2R(in_stack_ffffffffffffed40);
  DumpReader::~DumpReader(in_stack_ffffffffffffea60);
  return;
}

Assistant:

void P2Z::process() {
    Vector3d zhat = V3Zero;
    zhat[axis_]   = 1.0;  // unit vector along preferred axis

    StuntDouble* sd1;
    StuntDouble* sd2;
    int ii;
    int jj;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    nProcessed_ = nFrames / step_;
    P2_         = 0.0;
    count_      = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (doVect_) {
        for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
             sd1 = seleMan1_.nextSelected(ii)) {
          // only do this if the stunt double actually has a vector associated
          // with it
          if (sd1->isDirectional()) {
            Vector3d vec = sd1->getA().transpose() * V3Z;
            vec.normalize();
            RealType cosangle = dot(zhat, vec);

            P2_ += 0.5 * (3.0 * cosangle * cosangle - 1.0);
            count_++;
          }
        }
      } else {
        if (doOffset_) {
          for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
               sd1 = seleMan1_.nextSelected(ii)) {
            // This will require careful rewriting if StaticProps is
            // ever parallelized.  For an example, see
            // Thermo::getTaggedAtomPairDistance
            Vector3d r1;

            if (doOffset2_) {
              int sd1Aind       = sd1->getGlobalIndex() + seleOffset2_;
              StuntDouble* sd1A = info_->getIOIndexToIntegrableObject(sd1Aind);
              r1                = sd1A->getPos();
            } else {
              r1 = sd1->getPos();
            }

            int sd2Index = sd1->getGlobalIndex() + seleOffset_;
            sd2          = info_->getIOIndexToIntegrableObject(sd2Index);

            Vector3d r2  = sd2->getPos();
            Vector3d vec = r1 - r2;

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            vec.normalize();
            RealType cosangle = dot(zhat, vec);
            P2_ += 0.5 * (3.0 * cosangle * cosangle - 1.0);
            count_++;
          }
        } else {
          if (evaluator2_.isDynamic()) {
            seleMan2_.setSelectionSet(evaluator2_.evaluate());
          }

          if (seleMan1_.getSelectionCount() != seleMan2_.getSelectionCount()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "In frame %d, the number of selected StuntDoubles are\n"
                     "\tnot the same in --sele1 and sele2\n",
                     istep);
            painCave.severity = OPENMD_INFO;
            painCave.isFatal  = 0;
            simError();
          }

          for (sd1                             = seleMan1_.beginSelected(ii),
              sd2                              = seleMan2_.beginSelected(jj);
               sd1 != NULL && sd2 != NULL; sd1 = seleMan1_.nextSelected(ii),
              sd2                              = seleMan2_.nextSelected(jj)) {
            Vector3d r1  = sd1->getPos();
            Vector3d r2  = sd2->getPos();
            Vector3d vec = r1 - r2;

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            vec.normalize();
            RealType cosangle = dot(zhat, vec);
            P2_ += 0.5 * (3.0 * cosangle * cosangle - 1.0);
            count_++;
          }
        }
      }
    }
    processHistogram();
    writeP2R();
  }